

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PString::ReadValue(PString *this,FSerializer *ar,char *key,void *addr)

{
  char *in_RAX;
  char *cptr;
  char *local_18;
  
  local_18 = in_RAX;
  FSerializer::StringPtr(ar,key,&local_18);
  if (local_18 != (char *)0x0) {
    FString::operator=((FString *)addr,local_18);
  }
  return local_18 != (char *)0x0;
}

Assistant:

bool PString::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	const char *cptr;
	ar.StringPtr(key, cptr);
	if (cptr == nullptr)
	{
		return false;
	}
	else
	{
		*(FString*)addr = cptr;
		return true;
	}
}